

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_dr_flac *
ma_dr_flac_open_file_w(wchar_t *pFileName,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_dr_flac_seek_proc in_RSI;
  ma_dr_flac_read_proc in_RDI;
  FILE *pFile;
  ma_dr_flac *pFlac;
  ma_allocation_callbacks *in_stack_00000020;
  wchar_t *in_stack_00000028;
  wchar_t *in_stack_00000030;
  FILE **in_stack_00000038;
  FILE *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  ma_dr_flac *local_8;
  
  mVar1 = ma_wfopen(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  if (mVar1 == MA_SUCCESS) {
    local_8 = ma_dr_flac_open(in_RDI,in_RSI,in_stack_ffffffffffffffe0,
                              (ma_allocation_callbacks *)in_stack_ffffffffffffffd8);
    if (local_8 == (ma_dr_flac *)0x0) {
      fclose(in_stack_ffffffffffffffd8);
      local_8 = (ma_dr_flac *)0x0;
    }
  }
  else {
    local_8 = (ma_dr_flac *)0x0;
  }
  return local_8;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_file_w(const wchar_t* pFileName, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    FILE* pFile;
    if (ma_wfopen(&pFile, pFileName, L"rb", pAllocationCallbacks) != MA_SUCCESS) {
        return NULL;
    }
    pFlac = ma_dr_flac_open(ma_dr_flac__on_read_stdio, ma_dr_flac__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (pFlac == NULL) {
        fclose(pFile);
        return NULL;
    }
    return pFlac;
}